

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD5.c
# Opt level: O0

void md5_process(md5_state_t *pms,md5_byte_t *data)

{
  md5_word_t mVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int i;
  md5_byte_t *xp;
  md5_word_t *X;
  md5_word_t xbuf [16];
  md5_word_t t;
  md5_word_t d;
  md5_word_t c;
  md5_word_t b;
  md5_word_t a;
  md5_byte_t *data_local;
  md5_state_t *pms_local;
  
  mVar1 = pms->abcd[0];
  uVar5 = pms->abcd[1];
  uVar4 = pms->abcd[2];
  uVar3 = pms->abcd[3];
  xp = data;
  if (((ulong)data & 3) != 0) {
    memcpy(&X,data,0x40);
    xp = (md5_byte_t *)&X;
  }
  uVar2 = mVar1 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + *(int *)xp + 0xd76aa478;
  uVar2 = (uVar2 * 0x80 | uVar2 >> 0x19) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + *(int *)(xp + 4) + 0xe8c7b756;
  uVar3 = (uVar3 * 0x1000 | uVar3 >> 0x14) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + *(int *)(xp + 8) + 0x242070db;
  uVar4 = (uVar4 * 0x20000 | uVar4 >> 0xf) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + *(int *)(xp + 0xc) + 0xc1bdceee;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + *(int *)(xp + 0x10) + 0xf57c0faf;
  uVar2 = (uVar2 * 0x80 | uVar2 >> 0x19) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + *(int *)(xp + 0x14) + 0x4787c62a;
  uVar3 = (uVar3 * 0x1000 | uVar3 >> 0x14) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + *(int *)(xp + 0x18) + 0xa8304613;
  uVar4 = (uVar4 * 0x20000 | uVar4 >> 0xf) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + *(int *)(xp + 0x1c) + 0xfd469501;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + *(int *)(xp + 0x20) + 0x698098d8;
  uVar2 = (uVar2 * 0x80 | uVar2 >> 0x19) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + *(int *)(xp + 0x24) + 0x8b44f7af;
  uVar3 = (uVar3 * 0x1000 | uVar3 >> 0x14) + uVar2;
  uVar4 = (uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + *(int *)(xp + 0x28)) - 0xa44f;
  uVar4 = (uVar4 * 0x20000 | uVar4 >> 0xf) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + *(int *)(xp + 0x2c) + 0x895cd7be;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar4 | (uVar5 ^ 0xffffffff) & uVar3) + *(int *)(xp + 0x30) + 0x6b901122;
  uVar2 = (uVar2 * 0x80 | uVar2 >> 0x19) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar5 | (uVar2 ^ 0xffffffff) & uVar4) + *(int *)(xp + 0x34) + 0xfd987193;
  uVar3 = (uVar3 * 0x1000 | uVar3 >> 0x14) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar2 | (uVar3 ^ 0xffffffff) & uVar5) + *(int *)(xp + 0x38) + 0xa679438e;
  uVar4 = (uVar4 * 0x20000 | uVar4 >> 0xf) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar3 | (uVar4 ^ 0xffffffff) & uVar2) + *(int *)(xp + 0x3c) + 0x49b40821;
  uVar5 = (uVar5 * 0x400000 | uVar5 >> 10) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + *(int *)(xp + 4) + 0xf61e2562;
  uVar2 = (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + *(int *)(xp + 0x18) + 0xc040b340;
  uVar3 = (uVar3 * 0x200 | uVar3 >> 0x17) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + *(int *)(xp + 0x2c) + 0x265e5a51;
  uVar4 = (uVar4 * 0x4000 | uVar4 >> 0x12) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + *(int *)xp + 0xe9b6c7aa;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + *(int *)(xp + 0x14) + 0xd62f105d;
  uVar2 = (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + *(int *)(xp + 0x28) + 0x2441453;
  uVar3 = (uVar3 * 0x200 | uVar3 >> 0x17) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + *(int *)(xp + 0x3c) + 0xd8a1e681;
  uVar4 = (uVar4 * 0x4000 | uVar4 >> 0x12) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + *(int *)(xp + 0x10) + 0xe7d3fbc8;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + *(int *)(xp + 0x24) + 0x21e1cde6;
  uVar2 = (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + *(int *)(xp + 0x38) + 0xc33707d6;
  uVar3 = (uVar3 * 0x200 | uVar3 >> 0x17) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + *(int *)(xp + 0xc) + 0xf4d50d87;
  uVar4 = (uVar4 * 0x4000 | uVar4 >> 0x12) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + *(int *)(xp + 0x20) + 0x455a14ed;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar4;
  uVar2 = uVar2 + (uVar5 & uVar3 | uVar4 & (uVar3 ^ 0xffffffff)) + *(int *)(xp + 0x34) + 0xa9e3e905;
  uVar2 = (uVar2 * 0x20 | uVar2 >> 0x1b) + uVar5;
  uVar3 = uVar3 + (uVar2 & uVar4 | uVar5 & (uVar4 ^ 0xffffffff)) + *(int *)(xp + 8) + 0xfcefa3f8;
  uVar3 = (uVar3 * 0x200 | uVar3 >> 0x17) + uVar2;
  uVar4 = uVar4 + (uVar3 & uVar5 | uVar2 & (uVar5 ^ 0xffffffff)) + *(int *)(xp + 0x1c) + 0x676f02d9;
  uVar4 = (uVar4 * 0x4000 | uVar4 >> 0x12) + uVar3;
  uVar5 = uVar5 + (uVar4 & uVar2 | uVar3 & (uVar2 ^ 0xffffffff)) + *(int *)(xp + 0x30) + 0x8d2a4c8a;
  uVar5 = (uVar5 * 0x100000 | uVar5 >> 0xc) + uVar4;
  uVar2 = (uVar2 + (uVar5 ^ uVar4 ^ uVar3) + *(int *)(xp + 0x14)) - 0x5c6be;
  uVar2 = (uVar2 * 0x10 | uVar2 >> 0x1c) + uVar5;
  uVar3 = uVar3 + (uVar2 ^ uVar5 ^ uVar4) + *(int *)(xp + 0x20) + 0x8771f681;
  uVar3 = (uVar3 * 0x800 | uVar3 >> 0x15) + uVar2;
  uVar4 = uVar4 + (uVar3 ^ uVar2 ^ uVar5) + *(int *)(xp + 0x2c) + 0x6d9d6122;
  uVar4 = (uVar4 * 0x10000 | uVar4 >> 0x10) + uVar3;
  uVar5 = uVar5 + (uVar4 ^ uVar3 ^ uVar2) + *(int *)(xp + 0x38) + 0xfde5380c;
  uVar5 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar4;
  uVar2 = uVar2 + (uVar5 ^ uVar4 ^ uVar3) + *(int *)(xp + 4) + 0xa4beea44;
  uVar2 = (uVar2 * 0x10 | uVar2 >> 0x1c) + uVar5;
  uVar3 = uVar3 + (uVar2 ^ uVar5 ^ uVar4) + *(int *)(xp + 0x10) + 0x4bdecfa9;
  uVar3 = (uVar3 * 0x800 | uVar3 >> 0x15) + uVar2;
  uVar4 = uVar4 + (uVar3 ^ uVar2 ^ uVar5) + *(int *)(xp + 0x1c) + 0xf6bb4b60;
  uVar4 = (uVar4 * 0x10000 | uVar4 >> 0x10) + uVar3;
  uVar5 = uVar5 + (uVar4 ^ uVar3 ^ uVar2) + *(int *)(xp + 0x28) + 0xbebfbc70;
  uVar5 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar4;
  uVar2 = uVar2 + (uVar5 ^ uVar4 ^ uVar3) + *(int *)(xp + 0x34) + 0x289b7ec6;
  uVar2 = (uVar2 * 0x10 | uVar2 >> 0x1c) + uVar5;
  uVar3 = uVar3 + (uVar2 ^ uVar5 ^ uVar4) + *(int *)xp + 0xeaa127fa;
  uVar3 = (uVar3 * 0x800 | uVar3 >> 0x15) + uVar2;
  uVar4 = uVar4 + (uVar3 ^ uVar2 ^ uVar5) + *(int *)(xp + 0xc) + 0xd4ef3085;
  uVar4 = (uVar4 * 0x10000 | uVar4 >> 0x10) + uVar3;
  uVar5 = uVar5 + (uVar4 ^ uVar3 ^ uVar2) + *(int *)(xp + 0x18) + 0x4881d05;
  uVar5 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar4;
  uVar2 = uVar2 + (uVar5 ^ uVar4 ^ uVar3) + *(int *)(xp + 0x24) + 0xd9d4d039;
  uVar2 = (uVar2 * 0x10 | uVar2 >> 0x1c) + uVar5;
  uVar3 = uVar3 + (uVar2 ^ uVar5 ^ uVar4) + *(int *)(xp + 0x30) + 0xe6db99e5;
  uVar3 = (uVar3 * 0x800 | uVar3 >> 0x15) + uVar2;
  uVar4 = uVar4 + (uVar3 ^ uVar2 ^ uVar5) + *(int *)(xp + 0x3c) + 0x1fa27cf8;
  uVar4 = (uVar4 * 0x10000 | uVar4 >> 0x10) + uVar3;
  uVar5 = uVar5 + (uVar4 ^ uVar3 ^ uVar2) + *(int *)(xp + 8) + 0xc4ac5665;
  uVar5 = (uVar5 * 0x800000 | uVar5 >> 9) + uVar4;
  uVar2 = uVar2 + (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + *(int *)xp + 0xf4292244;
  uVar2 = (uVar2 * 0x40 | uVar2 >> 0x1a) + uVar5;
  uVar3 = uVar3 + (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + *(int *)(xp + 0x1c) + 0x432aff97;
  uVar3 = (uVar3 * 0x400 | uVar3 >> 0x16) + uVar2;
  uVar4 = uVar4 + (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + *(int *)(xp + 0x38) + 0xab9423a7;
  uVar4 = (uVar4 * 0x8000 | uVar4 >> 0x11) + uVar3;
  uVar5 = uVar5 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *(int *)(xp + 0x14) + 0xfc93a039;
  uVar5 = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar4;
  uVar2 = uVar2 + (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + *(int *)(xp + 0x30) + 0x655b59c3;
  uVar2 = (uVar2 * 0x40 | uVar2 >> 0x1a) + uVar5;
  uVar3 = uVar3 + (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + *(int *)(xp + 0xc) + 0x8f0ccc92;
  uVar3 = (uVar3 * 0x400 | uVar3 >> 0x16) + uVar2;
  uVar4 = (uVar4 + (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + *(int *)(xp + 0x28)) - 0x100b83;
  uVar4 = (uVar4 * 0x8000 | uVar4 >> 0x11) + uVar3;
  uVar5 = uVar5 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *(int *)(xp + 4) + 0x85845dd1;
  uVar5 = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar4;
  uVar2 = uVar2 + (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + *(int *)(xp + 0x20) + 0x6fa87e4f;
  uVar2 = (uVar2 * 0x40 | uVar2 >> 0x1a) + uVar5;
  uVar3 = uVar3 + (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + *(int *)(xp + 0x3c) + 0xfe2ce6e0;
  uVar3 = (uVar3 * 0x400 | uVar3 >> 0x16) + uVar2;
  uVar4 = uVar4 + (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + *(int *)(xp + 0x18) + 0xa3014314;
  uVar4 = (uVar4 * 0x8000 | uVar4 >> 0x11) + uVar3;
  uVar5 = uVar5 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *(int *)(xp + 0x34) + 0x4e0811a1;
  uVar5 = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar4;
  uVar2 = uVar2 + (uVar4 ^ (uVar5 | uVar3 ^ 0xffffffff)) + *(int *)(xp + 0x10) + 0xf7537e82;
  uVar2 = (uVar2 * 0x40 | uVar2 >> 0x1a) + uVar5;
  uVar3 = uVar3 + (uVar5 ^ (uVar2 | uVar4 ^ 0xffffffff)) + *(int *)(xp + 0x2c) + 0xbd3af235;
  uVar3 = (uVar3 * 0x400 | uVar3 >> 0x16) + uVar2;
  uVar4 = uVar4 + (uVar2 ^ (uVar3 | uVar5 ^ 0xffffffff)) + *(int *)(xp + 8) + 0x2ad7d2bb;
  uVar4 = (uVar4 * 0x8000 | uVar4 >> 0x11) + uVar3;
  uVar5 = uVar5 + (uVar3 ^ (uVar4 | uVar2 ^ 0xffffffff)) + *(int *)(xp + 0x24) + 0xeb86d391;
  pms->abcd[0] = uVar2 + pms->abcd[0];
  pms->abcd[1] = (uVar5 * 0x200000 | uVar5 >> 0xb) + uVar4 + pms->abcd[1];
  pms->abcd[2] = uVar4 + pms->abcd[2];
  pms->abcd[3] = uVar3 + pms->abcd[3];
  return;
}

Assistant:

static void md5_process(md5_state_t* pms, const md5_byte_t* data /*[64]*/)
{
  md5_word_t a = pms->abcd[0];
  md5_word_t b = pms->abcd[1];
  md5_word_t c = pms->abcd[2];
  md5_word_t d = pms->abcd[3];
  md5_word_t t;
#if BYTE_ORDER > 0
  /* Define storage only for big-endian CPUs. */
  md5_word_t X[16];
#else
  /* Define storage for little-endian or both types of CPUs. */
  md5_word_t xbuf[16];
  const md5_word_t* X;
#endif

  {
#if BYTE_ORDER == 0
    /*
     * Determine dynamically whether this is a big-endian or
     * little-endian machine, since we can use a more efficient
     * algorithm on the latter.
     */
    static const int w = 1;

    if (*((const md5_byte_t*)&w)) /* dynamic little-endian */
#endif
#if BYTE_ORDER <= 0 /* little-endian */
    {
      /*
       * On little-endian machines, we can process properly aligned
       * data without copying it.
       */
      if (!((uintptr_t)data & 3)) {
        /* data are properly aligned */
        X = (const md5_word_t*)data;
      } else {
        /* not aligned */
        memcpy(xbuf, data, 64);
        X = xbuf;
      }
    }
#endif
#if BYTE_ORDER == 0
    else /* dynamic big-endian */
#endif
#if BYTE_ORDER >= 0 /* big-endian */
    {
      /*
       * On big-endian machines, we must arrange the bytes in the
       * right order.
       */
      const md5_byte_t* xp = data;
      int i;

#  if BYTE_ORDER == 0
      X = xbuf; /* (dynamic only) */
#  else
#    define xbuf X /* (static only) */
#  endif
      for (i = 0; i < 16; ++i, xp += 4) {
        xbuf[i] =
          (md5_word_t)(xp[0] + (xp[1] << 8) + (xp[2] << 16) + (xp[3] << 24));
      }
    }
#endif
  }

#define ROTATE_LEFT(x, n) (((x) << (n)) | ((x) >> (32 - (n))))

/* Round 1. */
/* Let [abcd k s i] denote the operation
   a = b + ((a + F(b,c,d) + X[k] + T[i]) <<< s). */
#define F(x, y, z) (((x) & (y)) | (~(x) & (z)))
#define SET(a, b, c, d, k, s, Ti)                                             \
  t = a + F(b, c, d) + X[k] + (Ti);                                           \
  a = ROTATE_LEFT(t, s) + b
  /* Do the following 16 operations. */
  SET(a, b, c, d, 0, 7, T1);
  SET(d, a, b, c, 1, 12, T2);
  SET(c, d, a, b, 2, 17, T3);
  SET(b, c, d, a, 3, 22, T4);
  SET(a, b, c, d, 4, 7, T5);
  SET(d, a, b, c, 5, 12, T6);
  SET(c, d, a, b, 6, 17, T7);
  SET(b, c, d, a, 7, 22, T8);
  SET(a, b, c, d, 8, 7, T9);
  SET(d, a, b, c, 9, 12, T10);
  SET(c, d, a, b, 10, 17, T11);
  SET(b, c, d, a, 11, 22, T12);
  SET(a, b, c, d, 12, 7, T13);
  SET(d, a, b, c, 13, 12, T14);
  SET(c, d, a, b, 14, 17, T15);
  SET(b, c, d, a, 15, 22, T16);
#undef SET

/* Round 2. */
/* Let [abcd k s i] denote the operation
     a = b + ((a + G(b,c,d) + X[k] + T[i]) <<< s). */
#define G(x, y, z) (((x) & (z)) | ((y) & ~(z)))
#define SET(a, b, c, d, k, s, Ti)                                             \
  t = a + G(b, c, d) + X[k] + (Ti);                                           \
  a = ROTATE_LEFT(t, s) + b
  /* Do the following 16 operations. */
  SET(a, b, c, d, 1, 5, T17);
  SET(d, a, b, c, 6, 9, T18);
  SET(c, d, a, b, 11, 14, T19);
  SET(b, c, d, a, 0, 20, T20);
  SET(a, b, c, d, 5, 5, T21);
  SET(d, a, b, c, 10, 9, T22);
  SET(c, d, a, b, 15, 14, T23);
  SET(b, c, d, a, 4, 20, T24);
  SET(a, b, c, d, 9, 5, T25);
  SET(d, a, b, c, 14, 9, T26);
  SET(c, d, a, b, 3, 14, T27);
  SET(b, c, d, a, 8, 20, T28);
  SET(a, b, c, d, 13, 5, T29);
  SET(d, a, b, c, 2, 9, T30);
  SET(c, d, a, b, 7, 14, T31);
  SET(b, c, d, a, 12, 20, T32);
#undef SET

/* Round 3. */
/* Let [abcd k s t] denote the operation
     a = b + ((a + H(b,c,d) + X[k] + T[i]) <<< s). */
#define H(x, y, z) ((x) ^ (y) ^ (z))
#define SET(a, b, c, d, k, s, Ti)                                             \
  t = a + H(b, c, d) + X[k] + (Ti);                                           \
  a = ROTATE_LEFT(t, s) + b
  /* Do the following 16 operations. */
  SET(a, b, c, d, 5, 4, T33);
  SET(d, a, b, c, 8, 11, T34);
  SET(c, d, a, b, 11, 16, T35);
  SET(b, c, d, a, 14, 23, T36);
  SET(a, b, c, d, 1, 4, T37);
  SET(d, a, b, c, 4, 11, T38);
  SET(c, d, a, b, 7, 16, T39);
  SET(b, c, d, a, 10, 23, T40);
  SET(a, b, c, d, 13, 4, T41);
  SET(d, a, b, c, 0, 11, T42);
  SET(c, d, a, b, 3, 16, T43);
  SET(b, c, d, a, 6, 23, T44);
  SET(a, b, c, d, 9, 4, T45);
  SET(d, a, b, c, 12, 11, T46);
  SET(c, d, a, b, 15, 16, T47);
  SET(b, c, d, a, 2, 23, T48);
#undef SET

/* Round 4. */
/* Let [abcd k s t] denote the operation
     a = b + ((a + I(b,c,d) + X[k] + T[i]) <<< s). */
#define I(x, y, z) ((y) ^ ((x) | ~(z)))
#define SET(a, b, c, d, k, s, Ti)                                             \
  t = a + I(b, c, d) + X[k] + (Ti);                                           \
  a = ROTATE_LEFT(t, s) + b
  /* Do the following 16 operations. */
  SET(a, b, c, d, 0, 6, T49);
  SET(d, a, b, c, 7, 10, T50);
  SET(c, d, a, b, 14, 15, T51);
  SET(b, c, d, a, 5, 21, T52);
  SET(a, b, c, d, 12, 6, T53);
  SET(d, a, b, c, 3, 10, T54);
  SET(c, d, a, b, 10, 15, T55);
  SET(b, c, d, a, 1, 21, T56);
  SET(a, b, c, d, 8, 6, T57);
  SET(d, a, b, c, 15, 10, T58);
  SET(c, d, a, b, 6, 15, T59);
  SET(b, c, d, a, 13, 21, T60);
  SET(a, b, c, d, 4, 6, T61);
  SET(d, a, b, c, 11, 10, T62);
  SET(c, d, a, b, 2, 15, T63);
  SET(b, c, d, a, 9, 21, T64);
#undef SET

  /* Then perform the following additions. (That is increment each
     of the four registers by the value it had before this block
     was started.) */
  pms->abcd[0] += a;
  pms->abcd[1] += b;
  pms->abcd[2] += c;
  pms->abcd[3] += d;
}